

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::learn<false,true,true,true,false,0ul,0ul,0ul>(gd *g,base_learner *base,example *ec)

{
  undefined8 in_RDX;
  example *in_RSI;
  base_learner *in_RDI;
  
  (**(code **)(in_RDI + 0x30))(in_RDI,in_RSI,in_RDX);
  update<false,true,true,true,false,0ul,0ul,0ul>((gd *)ec,in_RDI,in_RSI);
  return;
}

Assistant:

void learn(gd& g, base_learner& base, example& ec)
{
  // invariant: not a test label, importance weight > 0
  assert(ec.in_use);
  assert(ec.l.simple.label != FLT_MAX);
  assert(ec.weight > 0.);
  g.predict(g, base, ec);
  update<sparse_l2, invariant, sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare>(g, base, ec);
}